

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O3

void __thiscall PrintVisitor::visit(PrintVisitor *this,UnaryNode *node)

{
  ostream *poVar1;
  const_iterator cVar2;
  undefined8 uVar3;
  PrintVisitor visitor;
  undefined **local_48;
  ostream *local_40;
  int local_38;
  undefined4 uStack_34;
  
  poVar1 = this->stream_;
  local_48 = (undefined **)&local_38;
  std::__cxx11::string::_M_construct((ulong)&local_48,(char)this->indentation_);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)local_48,(long)local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Unary: ",7);
  cVar2 = std::
          _Hashtable<UnaryOperator,_std::pair<const_UnaryOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_UnaryOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<UnaryOperator>,_std::hash<UnaryOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&UnaryOperationNames_abi_cxx11_._M_h,&node->unaryOperator_);
  if (cVar2.
      super__Node_iterator_base<std::pair<const_UnaryOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,*(char **)((long)cVar2.
                                                super__Node_iterator_base<std::pair<const_UnaryOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                                ._M_cur + 0x10),
                        *(long *)((long)cVar2.
                                        super__Node_iterator_base<std::pair<const_UnaryOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                        ._M_cur + 0x18));
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    if (local_48 != (undefined **)&local_38) {
      operator_delete(local_48,CONCAT44(uStack_34,local_38) + 1);
    }
    local_40 = this->stream_;
    local_38 = this->indentation_ + 1;
    local_48 = &PTR__Visitor_0014fd88;
    (**(code **)((long)(((node->term_)._M_t.
                         super___uniq_ptr_impl<ExpressionNode,_std::default_delete<ExpressionNode>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ExpressionNode_*,_std::default_delete<ExpressionNode>_>
                         .super__Head_base<0UL,_ExpressionNode_*,_false>._M_head_impl)->super_Node).
                       _vptr_Node + 0x10))();
    return;
  }
  uVar3 = std::__throw_out_of_range("_Map_base::at");
  if (local_48 != (undefined **)&local_38) {
    operator_delete(local_48,CONCAT44(uStack_34,local_38) + 1);
  }
  _Unwind_Resume(uVar3);
}

Assistant:

void PrintVisitor::visit(const UnaryNode& node)
{
  stream_ << indent() << "Unary: " 
    << UnaryOperationNames.at(node.getOperation()) << "\n";
  auto visitor = PrintVisitor{stream_, indentation_ + 1};
  node.getTerm().accept(visitor);
}